

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O3

LY_ERR lyd_new_path_(lyd_node *parent,ly_ctx *ctx,lysc_ext_instance *ext,char *path,void *value,
                    size_t value_len,LYD_ANYDATA_VALUETYPE value_type,uint32_t options,
                    lyd_node **new_parent,lyd_node **new_node)

{
  ushort uVar1;
  ly_path_predicate *plVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  LY_ERR LVar6;
  int iVar7;
  size_t sVar8;
  lysc_node *plVar9;
  ly_path_predicate *plVar10;
  long *plVar11;
  ly_path_predicate *plVar12;
  char *pcVar13;
  ly_path_predicate *plVar14;
  long lVar15;
  char *format_00;
  ly_path_pred_type lVar16;
  ly_path_predicate *plVar17;
  ulong uVar18;
  lyd_node **first_sibling_p;
  lys_module *plVar19;
  lyd_node *plVar20;
  char *pcVar21;
  lyd_value *plVar22;
  uint uVar23;
  uint32_t hints;
  ly_ctx *ctx_00;
  ly_path_predicate **pplVar24;
  lyd_node *node;
  LY_VALUE_FORMAT format;
  size_t local_d0;
  ly_path *p;
  uint64_t path_idx;
  ly_path_predicate *local_b8;
  size_t local_b0;
  ly_ctx *local_a8;
  lyd_value *local_a0;
  undefined8 local_98;
  lyd_node *parent_local;
  ly_ctx *local_88;
  ly_path_predicate *local_80;
  lyd_node *nparent;
  size_t local_70;
  lyd_node *nnode;
  lyxp_expr *exp;
  lyd_node *iter;
  lysc_type *plStack_50;
  anon_union_24_16_e2776397_for_lyd_value_2 local_48;
  
  exp = (lyxp_expr *)0x0;
  p = (ly_path *)0x0;
  nparent = (lyd_node *)0x0;
  nnode = (lyd_node *)0x0;
  node = (lyd_node *)0x0;
  path_idx = 0;
  parent_local = parent;
  if (parent == (lyd_node *)0x0 && ctx == (ly_ctx *)0x0) {
    __assert_fail("parent || ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                  ,0x686,
                  "LY_ERR lyd_new_path_(struct lyd_node *, const struct ly_ctx *, const struct lysc_ext_instance *, const char *, const void *, size_t, LYD_ANYDATA_VALUETYPE, uint32_t, struct lyd_node **, struct lyd_node **)"
                 );
  }
  if ((parent == (lyd_node *)0x0) && (*path != '/')) {
    __assert_fail("path && ((path[0] == \'/\') || parent)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                  ,0x687,
                  "LY_ERR lyd_new_path_(struct lyd_node *, const struct ly_ctx *, const struct lysc_ext_instance *, const char *, const void *, size_t, LYD_ANYDATA_VALUETYPE, uint32_t, struct lyd_node **, struct lyd_node **)"
                 );
  }
  if (ctx == (ly_ctx *)0x0) {
    if (parent->schema == (lysc_node *)0x0) {
      plVar19 = (lys_module *)&parent[2].schema;
    }
    else {
      plVar19 = parent->schema->module;
    }
    ctx = plVar19->ctx;
  }
  local_98 = path;
  if (value_len == 0 && value != (void *)0x0) {
    value_len = strlen((char *)value);
  }
  LVar6 = lyd_new_val_get_format(options,&format);
  pcVar21 = local_98;
  if (LVar6 == LY_SUCCESS) {
    local_d0 = value_len;
    sVar8 = strlen(local_98);
    LVar6 = ly_path_parse(ctx,(lysc_node *)0x0,pcVar21,sVar8,'\0',2,0x40,0x200,&exp);
    plVar10 = (ly_path_predicate *)0x0;
    if (LVar6 == LY_SUCCESS) {
      plVar9 = lyd_node_schema(parent_local);
      LVar6 = ly_path_compile(ctx,(lys_module *)0x0,plVar9,ext,exp,((ushort)options & 1) + 1,0x20,
                              '\0',LY_VALUE_JSON,(void *)0x0,&p);
      plVar10 = (ly_path_predicate *)0x0;
      if (LVar6 == LY_SUCCESS) {
        if (p == (ly_path *)0x0) {
          __assert_fail("path",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                        ,0x61f,
                        "LY_ERR lyd_new_path_check_find_lypath(struct ly_path *, const char *, const char *, size_t, LY_VALUE_FORMAT, uint32_t)"
                       );
        }
        plVar14 = p[-1].predicates;
        plVar10 = plVar14;
        if (plVar14 != (ly_path_predicate *)0x0) {
          local_80 = (ly_path_predicate *)(ulong)format;
          pplVar24 = &p->predicates;
          plVar17 = (ly_path_predicate *)0x0;
          local_a0 = (lyd_value *)p;
          plVar10 = local_80;
          plVar22 = (lyd_value *)p;
          local_b8 = plVar14;
          local_a8 = (ly_ctx *)value;
          local_88 = ctx;
          bVar5 = false;
          do {
            plVar9 = ((ly_path *)(pplVar24 + -2))->node;
            plVar12 = plVar10;
            bVar4 = bVar5;
            if (plVar9->nodetype == 8) {
              plVar14 = *pplVar24;
              if ((plVar9->flags & 1) == 0) {
                if (plVar14 == (ly_path_predicate *)0x0) {
LAB_0012e410:
                  plVar12 = plVar17;
                  bVar4 = true;
                }
                else {
                  lVar16 = plVar14->type;
                  plVar12 = plVar17;
                  bVar4 = true;
                  if (lVar16 != LY_PATH_PREDTYPE_LEAFLIST) goto LAB_0012e327;
                }
              }
              else if (((plVar14 == (ly_path_predicate *)0x0) ||
                       (plVar14->type != LY_PATH_PREDTYPE_LEAFLIST)) &&
                      (((options & 0x40) == 0 ||
                       (LVar6 = lyd_value_validate((ly_ctx *)0x0,plVar9,(char *)local_a8,local_d0,
                                                   (lyd_node *)0x0,(lysc_type **)0x0,(char **)0x0),
                       LVar6 == LY_SUCCESS)))) {
                LVar6 = lyd_value_store(plVar9->module->ctx,(lyd_value *)&iter,
                                        (lysc_type *)plVar9[1].parent,local_a8,local_d0,'\0','\0',
                                        (ly_bool *)0x0,(LY_VALUE_FORMAT)local_80,(void *)0x0,0x3f3,
                                        plVar9,(ly_bool *)0x0);
                plVar10 = local_b8;
                ctx = local_88;
                if (LVar6 != LY_SUCCESS) goto LAB_0012e1d1;
                plStack_50->refcount = plStack_50->refcount + 1;
                plVar10 = *pplVar24;
                if (plVar10 == (ly_path_predicate *)0x0) {
                  plVar11 = (long *)malloc(0x40);
                  if (plVar11 == (long *)0x0) goto LAB_0012ec4c;
                  *plVar11 = 1;
                  lVar15 = 1;
                }
                else {
                  lVar15 = *(long *)((long)&plVar10[-1].field_1 + 0x28);
                  *(long *)((long)&plVar10[-1].field_1 + 0x28) = lVar15 + 1;
                  plVar11 = (long *)realloc((void *)((long)&plVar10[-1].field_1 + 0x28),
                                            lVar15 * 0x38 + 0x40);
                  if (plVar11 == (long *)0x0) {
                    plVar11 = (long *)((long)&(*pplVar24)[-1].field_1 + 0x28);
                    *plVar11 = *plVar11 + -1;
LAB_0012ec4c:
                    ly_log(plVar9->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                           "lyd_new_path_check_find_lypath");
                    plVar10 = local_b8;
                    ctx = local_88;
                    LVar6 = LY_EMEM;
                    goto LAB_0012e1d1;
                  }
                  lVar15 = *plVar11;
                }
                *pplVar24 = (ly_path_predicate *)(plVar11 + 1);
                plVar11[lVar15 * 7 + -6] = 0;
                (plVar11 + lVar15 * 7 + -6)[1] = 0;
                *(undefined4 *)(plVar11 + lVar15 * 7 + -6) = 2;
                plVar11[lVar15 * 7 + -4] = (long)iter;
                (plVar11 + lVar15 * 7 + -4)[1] = (long)plStack_50;
                plVar11[lVar15 * 7 + -2] = local_48.dec64;
                (plVar11 + lVar15 * 7 + -2)[1] = local_48._8_8_;
                plVar11[lVar15 * 7] = local_48._16_8_;
                plVar22 = local_a0;
              }
            }
            else if (plVar9->nodetype == 0x10) {
              plVar2 = *pplVar24;
              if ((plVar9->flags & 0x200) == 0) {
                if (((plVar2 == (ly_path_predicate *)0x0) || (plVar2->type != LY_PATH_PREDTYPE_LIST)
                    ) && (((options & 0x40) == 0 ||
                          (plVar17 < (ly_path_predicate *)((long)&plVar14[-1].field_1 + 0x2fU))))) {
                  ly_log_location(plVar9,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
                  ctx_00 = plVar9->module->ctx;
                  pcVar13 = lys_nodetype2str(plVar9->nodetype);
                  pcVar21 = plVar9->name;
                  format_00 = "Predicate missing for %s \"%s\" in path \"%s\".";
LAB_0012e591:
                  ly_vlog(ctx_00,(char *)0x0,LYVE_XPATH,format_00,pcVar13,pcVar21,local_98);
                  ly_log_location_revert(1,0,0,0);
                  plVar10 = local_b8;
                  ctx = local_88;
                  LVar6 = LY_EINVAL;
                  goto LAB_0012e1d1;
                }
              }
              else {
                if (plVar2 == (ly_path_predicate *)0x0) goto LAB_0012e410;
                lVar16 = plVar2->type;
LAB_0012e327:
                plVar12 = plVar10;
                bVar4 = bVar5;
                if (lVar16 != LY_PATH_PREDTYPE_POSITION) {
                  ly_log_location(plVar9,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
                  ctx_00 = plVar9->module->ctx;
                  pcVar13 = lys_nodetype2str(plVar9->nodetype);
                  pcVar21 = plVar9->name;
                  format_00 = "Invalid predicate for state %s \"%s\" in path \"%s\".";
                  goto LAB_0012e591;
                }
              }
            }
            plVar17 = (ly_path_predicate *)((long)&plVar17->type + 1);
            plVar14 = *(ly_path_predicate **)((long)&plVar22[-1].field_2 + 0x10);
            pplVar24 = pplVar24 + 3;
            plVar10 = plVar12;
            bVar5 = bVar4;
          } while (plVar17 < plVar14);
          value = local_a8;
          plVar10 = local_b8;
          ctx = local_88;
          if ((bVar4) && (plVar12 < plVar14)) {
            *(ly_path_predicate **)((long)&plVar22[-1].field_2 + 0x10) = plVar12;
          }
        }
        if (parent_local != (lyd_node *)0x0) {
          LVar6 = ly_path_eval_partial
                            (p,parent_local,(lyxp_var *)0x0,(byte)options & 0x80,&path_idx,&node);
          if (LVar6 == LY_EINCOMPLETE) {
            path_idx = path_idx + 1;
          }
          else if (LVar6 == LY_ENOTFOUND) {
            if (p->node == (lysc_node *)0x0) {
              plVar9 = (lysc_node *)0x0;
            }
            else {
              plVar9 = p->node->parent;
            }
            plVar9 = lysc_data_node(plVar9);
            if (plVar9 != (lysc_node *)0x0) {
              node = parent_local;
            }
          }
          else {
            if (LVar6 != LY_SUCCESS) goto LAB_0012e1d1;
            if (p == (ly_path *)0x0) {
              plVar14 = (ly_path_predicate *)0x0;
            }
            else {
              plVar14 = p[-1].predicates;
            }
            if (plVar10 == plVar14) {
              if ((options & 0x20) == 0) {
                if ((node->flags & 1) == 0) {
                  ly_log_location((lysc_node *)0x0,node,(char *)0x0,(ly_in *)0x0);
                  ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,"Path \"%s\" already exists.",local_98);
                  ly_log_location_revert(0,1,0,0);
                  LVar6 = LY_EEXIST;
                  goto LAB_0012e1d1;
                }
              }
              else {
                plVar9 = node->schema;
                if (((plVar9 != (lysc_node *)0x0) && (plVar9->nodetype == 4)) &&
                   (LVar6 = LY_SUCCESS, (plVar9->flags & 0x100) != 0)) goto LAB_0012e1d1;
              }
              LVar6 = lyd_new_path_update(node,value,local_d0,value_type,format,&nparent,&nnode);
              goto LAB_0012e1d1;
            }
          }
        }
        local_80 = (ly_path_predicate *)
                   (CONCAT71(local_80._1_7_,(byte)options >> 1) & 0xffffffffffffff01);
        local_98 = (char *)(CONCAT44(local_98._4_4_,options >> 8) & 0xffffffff00ffff01);
        do {
          if (p == (ly_path *)0x0) {
            plVar14 = _DAT_fffffffffffffff8;
            if (plVar10 == (ly_path_predicate *)0x0) {
              LVar6 = LY_SUCCESS;
              goto LAB_0012e12d;
            }
          }
          else {
            plVar14 = p[-1].predicates;
            if (plVar10 <= plVar14) goto LAB_0012e682;
          }
          p[-1].predicates = (ly_path_predicate *)((long)&plVar14->type + 1);
        } while( true );
      }
    }
  }
  else {
LAB_0012e12d:
    plVar10 = (ly_path_predicate *)0x0;
  }
  goto LAB_0012e1d1;
LAB_0012e682:
  if ((path_idx < plVar14) && (plVar9 = p[path_idx].node, plVar9 != (lysc_node *)0x0)) {
    if (plVar9->nodetype == 8) {
      if ((plVar9->flags & 1) == 0) goto LAB_0012e6bc;
    }
    else if ((plVar9->nodetype == 0x10) && ((plVar9->flags & 0x200) != 0)) {
LAB_0012e6bc:
      if ((p[path_idx].predicates != (ly_path_predicate *)0x0) &&
         ((p[path_idx].predicates)->type == LY_PATH_PREDTYPE_POSITION)) {
        plVar20 = parent_local;
        if (node != (lyd_node *)0x0) {
          if ((node->schema == (lysc_node *)0x0) || ((node->schema->nodetype & 0x711) != 0)) {
            plVar20 = *(lyd_node **)(node + 1);
          }
          else {
            plVar20 = (lyd_node *)0x0;
          }
        }
        uVar18 = 0;
        lyd_find_sibling_val(plVar20,plVar9,(char *)0x0,0,&iter);
        if (iter == (lyd_node *)0x0) {
          if (1 < ((p[path_idx].predicates)->field_1).position) {
LAB_0012edb7:
            ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,
                    "Cannot create \"%s\" on position %lu, no instances exist.",
                    (p[path_idx].node)->name);
            goto LAB_0012edd6;
          }
        }
        else {
          do {
            if (iter->schema != p[path_idx].node) break;
            uVar18 = (ulong)((int)uVar18 + 1);
            iter = iter->next;
          } while (iter != (lyd_node *)0x0);
          iVar7 = (int)uVar18;
          uVar3 = ((p[path_idx].predicates)->field_1).position;
          if (iVar7 + 1 < uVar3) {
            if (iVar7 == 0) goto LAB_0012edb7;
            pcVar13 = "";
            pcVar21 = "s";
            if (iVar7 == 1) {
              pcVar21 = "";
              pcVar13 = "s";
            }
            ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,
                    "Cannot create \"%s\" on position %lu, only %u instance%s exist%s.",
                    (p[path_idx].node)->name,uVar3,uVar18,pcVar21,pcVar13);
LAB_0012edd6:
            LVar6 = LY_EINVAL;
            goto LAB_0012e1d1;
          }
        }
      }
    }
  }
  local_88 = (ly_ctx *)0x1d59b8;
  if ((ly_ctx *)value != (ly_ctx *)0x0) {
    local_88 = (ly_ctx *)value;
  }
  local_a0 = (lyd_value *)0x0;
  do {
    plVar20 = node;
    LVar6 = LY_SUCCESS;
    if (p[-1].predicates <= path_idx) break;
    plVar9 = p[path_idx].node;
    uVar1 = plVar9->nodetype;
    if (0x1f < uVar1) {
      if (uVar1 < 0x100) {
        if ((uVar1 == 0x20) || (uVar1 == 0x60)) {
          LVar6 = lyd_create_any(plVar9,value,value_type,(ly_bool)local_98,&node);
          goto LAB_0012ea66;
        }
      }
      else if (((uVar1 == 0x100) || (uVar1 == 0x200)) || (uVar1 == 0x400)) goto LAB_0012e842;
LAB_0012ec84:
      ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
             ,0x73e);
      LVar6 = LY_EINT;
      break;
    }
    if (uVar1 < 8) {
      if (uVar1 == 1) {
LAB_0012e842:
        LVar6 = lyd_create_inner(plVar9,&node);
        if (LVar6 == LY_SUCCESS) goto LAB_0012ea6e;
        LVar6 = LY_EMEM;
        break;
      }
      if (uVar1 != 4) goto LAB_0012ec84;
      if (((plVar9->flags & 0x100) == 0) || (node->schema == (lysc_node *)0x0)) {
        if (((options & 0x40) == 0) ||
           (((node == (lyd_node *)0x0 || (node->schema != (lysc_node *)0x0)) &&
            ((LVar6 = lyd_value_validate((ly_ctx *)0x0,plVar9,(char *)local_88,local_d0,
                                         (lyd_node *)0x0,(lysc_type **)0x0,(char **)0x0),
             LVar6 == LY_SUCCESS || (LVar6 == LY_EINCOMPLETE)))))) {
          LVar6 = lyd_create_term(plVar9,(char *)value,local_d0,'\0',(ly_bool)local_80,
                                  (ly_bool *)0x0,format,(void *)0x0,0x3f3,(ly_bool *)0x0,&node);
          goto LAB_0012ea66;
        }
        if (format == LY_VALUE_JSON && (ly_ctx *)value != (ly_ctx *)0x0) {
          local_b8 = plVar10;
          local_a8 = (ly_ctx *)value;
          iVar7 = ly_strncmp("[null]",(char *)value,local_d0);
          uVar23 = (uint)(iVar7 == 0);
          goto LAB_0012eb35;
        }
        hints = 0;
        local_b8 = plVar10;
        local_a8 = (ly_ctx *)value;
        goto LAB_0012eb74;
      }
      if ((node->schema->nodetype & 0x711) == 0) {
        plVar20 = (lyd_node *)0x0;
      }
      else {
        plVar20 = *(lyd_node **)(node + 1);
      }
      lyd_find_sibling_schema(plVar20,plVar9,&node);
      if (node == (lyd_node *)0x0) {
        __assert_fail("node",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                      ,0x71d,
                      "LY_ERR lyd_new_path_(struct lyd_node *, const struct ly_ctx *, const struct lysc_ext_instance *, const char *, const void *, size_t, LYD_ANYDATA_VALUETYPE, uint32_t, struct lyd_node **, struct lyd_node **)"
                     );
      }
    }
    else {
      if (uVar1 == 8) {
        if ((((options & 0x40) != 0) &&
            ((p[path_idx].predicates == (ly_path_predicate *)0x0 ||
             ((p[path_idx].predicates)->type != LY_PATH_PREDTYPE_LEAFLIST)))) &&
           (((plVar9->flags & 1) != 0 ||
            ((LVar6 = lyd_value_validate((ly_ctx *)0x0,plVar9,(char *)local_88,local_d0,
                                         (lyd_node *)0x0,(lysc_type **)0x0,(char **)0x0),
             LVar6 != LY_SUCCESS && (LVar6 != LY_EINCOMPLETE)))))) {
          if (format == LY_VALUE_JSON && (ly_ctx *)value != (ly_ctx *)0x0) {
            local_b8 = plVar10;
            local_a8 = (ly_ctx *)value;
            iVar7 = ly_strncmp("[null]",(char *)value,local_d0);
            uVar23 = iVar7 == 0 | 4;
LAB_0012eb35:
            hints = uVar23 << 6;
          }
          else {
            hints = 0x100;
            local_b8 = plVar10;
            local_a8 = (ly_ctx *)value;
          }
LAB_0012eb74:
          local_b0 = (size_t)format;
          pcVar21 = plVar9->name;
          local_70 = strlen(pcVar21);
          pcVar13 = plVar9->module->name;
          sVar8 = strlen(pcVar13);
          value = local_a8;
          LVar6 = lyd_create_opaq(ctx,pcVar21,local_70,(char *)0x0,0,pcVar13,sVar8,(char *)local_a8,
                                  local_d0,(ly_bool *)0x0,(LY_VALUE_FORMAT)local_b0,(void *)0x0,
                                  hints,&node);
          plVar10 = local_b8;
          if (LVar6 == LY_SUCCESS) goto LAB_0012ea6e;
          break;
        }
        plVar14 = p[path_idx].predicates;
        if ((plVar14 == (ly_path_predicate *)0x0) || (plVar14->type != LY_PATH_PREDTYPE_LEAFLIST)) {
          if (local_a0 == (lyd_value *)0x0) {
            LVar6 = lyd_create_term(plVar9,(char *)value,local_d0,'\0',(ly_bool)local_80,
                                    (ly_bool *)0x0,format,(void *)0x0,0x3f3,(ly_bool *)0x0,&node);
            local_a0 = (lyd_value *)0x0;
            goto LAB_0012ea66;
          }
        }
        else {
          local_a0 = (lyd_value *)&(plVar14->field_1).field_1.field_1;
        }
        LVar6 = lyd_create_term2(plVar9,local_a0,&node);
      }
      else {
        if (uVar1 != 0x10) goto LAB_0012ec84;
        if ((plVar9->flags & 0x200) != 0) goto LAB_0012e842;
        if (((options & 0x40) == 0) || (p[path_idx].predicates != (ly_path_predicate *)0x0)) {
          LVar6 = lyd_create_list(plVar9,p[path_idx].predicates,(lyxp_var *)0x0,(ly_bool)local_80,
                                  &node);
        }
        else {
          local_b8 = (ly_path_predicate *)plVar9->name;
          local_b0 = strlen((char *)local_b8);
          pcVar21 = plVar9->module->name;
          sVar8 = strlen(pcVar21);
          LVar6 = lyd_create_opaq(ctx,(char *)local_b8,local_b0,(char *)0x0,0,pcVar21,sVar8,
                                  (char *)0x0,0,(ly_bool *)0x0,LY_VALUE_JSON,(void *)0x0,0x80,&node)
          ;
        }
      }
LAB_0012ea66:
      if (LVar6 != LY_SUCCESS) break;
LAB_0012ea6e:
      if (p[path_idx].ext != (lysc_ext_instance *)0x0) {
        node->flags = node->flags | 8;
      }
      if (plVar20 == (lyd_node *)0x0) {
        if (parent_local == (lyd_node *)0x0) goto LAB_0012eab9;
        plVar20 = (lyd_node *)0x0;
        first_sibling_p = &parent_local;
      }
      else {
        first_sibling_p = (lyd_node **)0x0;
      }
      lyd_insert_node(plVar20,first_sibling_p,node,0);
    }
LAB_0012eab9:
    nnode = node;
    if (nparent == (lyd_node *)0x0) {
      nparent = node;
    }
    path_idx = path_idx + 1;
    LVar6 = LY_SUCCESS;
  } while (p != (ly_path *)0x0);
LAB_0012e1d1:
  lyxp_expr_free(ctx,exp);
  if ((p != (ly_path *)0x0) && (p[-1].predicates < plVar10)) {
    plVar14 = (ly_path_predicate *)((long)&(p[-1].predicates)->type + 1);
    if (plVar14 < plVar10) {
      plVar14 = plVar10;
    }
    p[-1].predicates = plVar14;
  }
  ly_path_free(p);
  if (LVar6 == LY_SUCCESS) {
    if (new_parent != (lyd_node **)0x0) {
      *new_parent = nparent;
    }
    if (new_node != (lyd_node **)0x0) {
      *new_node = nnode;
    }
  }
  else {
    lyd_free_tree(nparent);
  }
  return LVar6;
}

Assistant:

static LY_ERR
lyd_new_path_(struct lyd_node *parent, const struct ly_ctx *ctx, const struct lysc_ext_instance *ext, const char *path,
        const void *value, size_t value_len, LYD_ANYDATA_VALUETYPE value_type, uint32_t options,
        struct lyd_node **new_parent, struct lyd_node **new_node)
{
    LY_ERR ret = LY_SUCCESS, r;
    struct lyxp_expr *exp = NULL;
    struct ly_path *p = NULL;
    struct lyd_node *nparent = NULL, *nnode = NULL, *node = NULL, *cur_parent, *iter;
    const struct lysc_node *schema;
    const struct lyd_value *val = NULL;
    ly_bool store_only = (options & LYD_NEW_VAL_STORE_ONLY) ? 1 : 0;
    ly_bool any_use_value = (options & LYD_NEW_ANY_USE_VALUE) ? 1 : 0;
    LY_ARRAY_COUNT_TYPE path_idx = 0, orig_count = 0;
    LY_VALUE_FORMAT format;
    uint32_t hints, count;

    assert(parent || ctx);
    assert(path && ((path[0] == '/') || parent));

    if (!ctx) {
        ctx = LYD_CTX(parent);
    }
    if (value && !value_len) {
        value_len = strlen(value);
    }
    LY_CHECK_GOTO(ret = lyd_new_val_get_format(options, &format), cleanup);

    /* parse path */
    LY_CHECK_GOTO(ret = ly_path_parse(ctx, NULL, path, strlen(path), 0, LY_PATH_BEGIN_EITHER, LY_PATH_PREFIX_FIRST,
            LY_PATH_PRED_SIMPLE, &exp), cleanup);

    /* compile path */
    LY_CHECK_GOTO(ret = ly_path_compile(ctx, NULL, lyd_node_schema(parent), ext, exp, options & LYD_NEW_VAL_OUTPUT ?
            LY_PATH_OPER_OUTPUT : LY_PATH_OPER_INPUT, LY_PATH_TARGET_MANY, 0, LY_VALUE_JSON, NULL, &p), cleanup);

    /* check the compiled path before searching existing nodes, it may be shortened */
    orig_count = LY_ARRAY_COUNT(p);
    LY_CHECK_GOTO(ret = lyd_new_path_check_find_lypath(p, path, value, value_len, format, options), cleanup);

    /* try to find any existing nodes in the path */
    if (parent) {
        r = ly_path_eval_partial(p, parent, NULL, options & LYD_NEW_PATH_WITH_OPAQ, &path_idx, &node);
        if (r == LY_SUCCESS) {
            if (orig_count == LY_ARRAY_COUNT(p)) {
                /* the node exists, are we supposed to update it or is it just a default? */
                if (!(options & LYD_NEW_PATH_UPDATE) && !(node->flags & LYD_DEFAULT)) {
                    LOG_LOCSET(NULL, node);
                    LOGVAL(ctx, LYVE_REFERENCE, "Path \"%s\" already exists.", path);
                    LOG_LOCBACK(0, 1);
                    ret = LY_EEXIST;
                    goto cleanup;
                } else if ((options & LYD_NEW_PATH_UPDATE) && lysc_is_key(node->schema)) {
                    /* fine, the key value must not be changed and has to be in the predicate to be found */
                    goto cleanup;
                }

                /* update the existing node */
                ret = lyd_new_path_update(node, value, value_len, value_type, format, &nparent, &nnode);
                goto cleanup;
            } /* else we were not searching for the whole path */
        } else if (r == LY_EINCOMPLETE) {
            /* some nodes were found, adjust the iterator to the next segment to be created */
            ++path_idx;
        } else if (r == LY_ENOTFOUND) {
            /* we will create the nodes from top-level, default behavior (absolute path), or from the parent (relative path) */
            if (lysc_data_parent(p[0].node)) {
                node = parent;
            }
        } else {
            /* error */
            ret = r;
            goto cleanup;
        }
    }

    /* restore the full path for creating new nodes */
    while (orig_count > LY_ARRAY_COUNT(p)) {
        LY_ARRAY_INCREMENT(p);
    }

    if ((path_idx < LY_ARRAY_COUNT(p)) && lysc_is_dup_inst_list(p[path_idx].node) && p[path_idx].predicates &&
            (p[path_idx].predicates[0].type == LY_PATH_PREDTYPE_POSITION)) {
        /* check the used position of a key-less list or state leaf-list */
        count = 0;
        LYD_LIST_FOR_INST(node ? lyd_child(node) : parent, p[path_idx].node, iter) {
            ++count;
        }

        if (count + 1 < p[path_idx].predicates[0].position) {
            if (count) {
                LOGVAL(ctx, LYVE_REFERENCE,
                        "Cannot create \"%s\" on position %" PRIu64 ", only %" PRIu32 " instance%s exist%s.",
                        p[path_idx].node->name, p[path_idx].predicates[0].position, count, (count > 1) ? "s" : "",
                        (count > 1) ? "" : "s");
            } else {
                LOGVAL(ctx, LYVE_REFERENCE, "Cannot create \"%s\" on position %" PRIu64 ", no instances exist.",
                        p[path_idx].node->name, p[path_idx].predicates[0].position);
            }
            ret = LY_EINVAL;
            goto cleanup;
        }
    }

    /* create all the non-existing nodes in a loop */
    for ( ; path_idx < LY_ARRAY_COUNT(p); ++path_idx) {
        cur_parent = node;
        schema = p[path_idx].node;

        switch (schema->nodetype) {
        case LYS_LIST:
            if (lysc_is_dup_inst_list(schema)) {
                /* create key-less list instance */
                LY_CHECK_GOTO(ret = lyd_create_inner(schema, &node), cleanup);
            } else if ((options & LYD_NEW_PATH_OPAQ) && !p[path_idx].predicates) {
                /* creating opaque list without keys */
                LY_CHECK_GOTO(ret = lyd_create_opaq(ctx, schema->name, strlen(schema->name), NULL, 0,
                        schema->module->name, strlen(schema->module->name), NULL, 0, NULL, LY_VALUE_JSON, NULL,
                        LYD_NODEHINT_LIST, &node), cleanup);
            } else {
                /* create standard list instance */
                LY_CHECK_GOTO(ret = lyd_create_list(schema, p[path_idx].predicates, NULL, store_only, &node), cleanup);
            }
            break;
        case LYS_CONTAINER:
        case LYS_NOTIF:
        case LYS_RPC:
        case LYS_ACTION:
            LY_CHECK_GOTO(ret = lyd_create_inner(schema, &node), cleanup);
            break;
        case LYS_LEAFLIST:
            if ((options & LYD_NEW_PATH_OPAQ) &&
                    (!p[path_idx].predicates || (p[path_idx].predicates[0].type != LY_PATH_PREDTYPE_LEAFLIST))) {
                /* we have not checked this only for dup-inst lists, otherwise it must be opaque */
                r = LY_EVALID;
                if (lysc_is_dup_inst_list(schema)) {
                    /* validate value */
                    r = lyd_value_validate(NULL, schema, value ? value : "", value_len, NULL, NULL, NULL);
                }
                if (r && (r != LY_EINCOMPLETE)) {
                    /* creating opaque leaf-list */
                    hints = LYD_NODEHINT_LEAFLIST;
                    if (value && (format == LY_VALUE_JSON) && !ly_strncmp("[null]", value, value_len)) {
                        hints |= LYD_VALHINT_EMPTY;
                    }
                    LY_CHECK_GOTO(ret = lyd_create_opaq(ctx, schema->name, strlen(schema->name), NULL, 0,
                            schema->module->name, strlen(schema->module->name), value, value_len, NULL, format, NULL,
                            hints, &node), cleanup);
                    break;
                }
            }

            /* get value to set */
            if (p[path_idx].predicates && (p[path_idx].predicates[0].type == LY_PATH_PREDTYPE_LEAFLIST)) {
                val = &p[path_idx].predicates[0].value;
            }

            /* create a leaf-list instance */
            if (val) {
                LY_CHECK_GOTO(ret = lyd_create_term2(schema, val, &node), cleanup);
            } else {
                LY_CHECK_GOTO(ret = lyd_create_term(schema, value, value_len, 0, store_only, NULL, format, NULL, LYD_HINT_DATA, NULL, &node), cleanup);
            }
            break;
        case LYS_LEAF:
            if (lysc_is_key(schema) && cur_parent->schema) {
                /* it must have been already created or some error will occur later */
                lyd_find_sibling_schema(lyd_child(cur_parent), schema, &node);
                assert(node);
                goto next_iter;
            }

            if (options & LYD_NEW_PATH_OPAQ) {
                if (cur_parent && !cur_parent->schema) {
                    /* always create opaque nodes for opaque parents */
                    r = LY_ENOT;
                } else {
                    /* validate value */
                    r = lyd_value_validate(NULL, schema, value ? value : "", value_len, NULL, NULL, NULL);
                }
                if (r && (r != LY_EINCOMPLETE)) {
                    /* creating opaque leaf */
                    hints = 0;
                    if (value && (format == LY_VALUE_JSON) && !ly_strncmp("[null]", value, value_len)) {
                        hints |= LYD_VALHINT_EMPTY;
                    }
                    LY_CHECK_GOTO(ret = lyd_create_opaq(ctx, schema->name, strlen(schema->name), NULL, 0,
                            schema->module->name, strlen(schema->module->name), value, value_len, NULL, format, NULL, hints, &node),
                            cleanup);
                    break;
                }
            }

            /* create a leaf instance */
            LY_CHECK_GOTO(ret = lyd_create_term(schema, value, value_len, 0, store_only, NULL, format, NULL, LYD_HINT_DATA, NULL, &node), cleanup);
            break;
        case LYS_ANYDATA:
        case LYS_ANYXML:
            LY_CHECK_GOTO(ret = lyd_create_any(schema, value, value_type, any_use_value, &node), cleanup);
            break;
        default:
            LOGINT(ctx);
            ret = LY_EINT;
            goto cleanup;
        }

        if (p[path_idx].ext) {
            node->flags |= LYD_EXT;
        }
        if (cur_parent) {
            /* connect to the parent */
            lyd_insert_node(cur_parent, NULL, node, LYD_INSERT_NODE_DEFAULT);
        } else if (parent) {
            /* connect to top-level siblings */
            lyd_insert_node(NULL, &parent, node, LYD_INSERT_NODE_DEFAULT);
        }

next_iter:
        /* update remembered nodes */
        if (!nparent) {
            nparent = node;
        }
        nnode = node;
    }

cleanup:
    lyxp_expr_free(ctx, exp);
    if (p) {
        while (orig_count > LY_ARRAY_COUNT(p)) {
            LY_ARRAY_INCREMENT(p);
        }
    }
    ly_path_free(p);
    if (!ret) {
        /* set out params only on success */
        if (new_parent) {
            *new_parent = nparent;
        }
        if (new_node) {
            *new_node = nnode;
        }
    } else {
        lyd_free_tree(nparent);
    }
    return ret;
}